

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::null_scoped_padder>::format
          (mdc_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  mdc_map_t *mdc_map;
  
  mdc_map = mdc::get_context_abi_cxx11_();
  if ((mdc_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    format_mdc(this,mdc_map,dest);
    return;
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override {
        auto &mdc_map = mdc::get_context();
        if (mdc_map.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        } else {
            format_mdc(mdc_map, dest);
        }
    }